

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O3

MethodHandle * __thiscall
jsonrpccxx::methodHandle<float,float,float>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<float_(float,_float)> *method)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<float_(float,_float)>::function
            ((function<float_(float,_float)> *)&local_30,(function<float_(float,_float)> *)this);
  createMethodHandle<float,float,float,0ul,1ul>(__return_storage_ptr__,(jsonrpccxx *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }